

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,void>,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>
          *alloc_ref)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ctrl_t *pcVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = this->old_capacity_;
  if (7 < uVar7) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar7 < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (uVar7 != 0) {
        pcVar3 = (this->old_heap_or_soo_).heap.control;
        lVar4 = *(long *)((long)&this->old_heap_or_soo_ + 8);
        lVar5 = *(long *)((long)&c->heap_or_soo_ + 8);
        lVar8 = 0;
        uVar9 = 0;
        do {
          if (kSentinel < pcVar3[uVar9]) {
            uVar6 = ((undefined8 *)(lVar4 + lVar8))[1];
            puVar1 = (undefined8 *)(lVar5 + 0x20 + lVar8);
            *puVar1 = *(undefined8 *)(lVar4 + lVar8);
            puVar1[1] = uVar6;
            puVar1 = (undefined8 *)(lVar4 + 0x10 + lVar8);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)(lVar5 + 0x30 + lVar8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            puVar1 = (undefined8 *)(lVar4 + 8 + lVar8);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)(lVar4 + 0x18 + lVar8) = 0;
            uVar7 = this->old_capacity_;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < uVar7);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }